

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O3

MPP_RET rc_model_v2_start(void *ctx,EncRcTask *task)

{
  EncRcTaskInfo *cfg;
  ulong uVar1;
  RK_U32 RVar2;
  int iVar3;
  int iVar4;
  RK_S32 value;
  EncFrmType EVar5;
  undefined8 in_RAX;
  RK_S64 RVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  EncFrmType EVar11;
  int iVar12;
  long lVar13;
  RcCfg *usr_cfg;
  uint uVar14;
  undefined4 uVar16;
  undefined8 uVar15;
  
  uVar16 = (undefined4)((ulong)in_RAX >> 0x20);
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","rc_model_v2_start",ctx);
  }
  if (*(int *)((long)ctx + 8) == 2) {
    iVar3 = *(int *)((long)ctx + 0x5c);
    if (iVar3 < 1) {
      _mpp_log_l(4,"rc_model_v2","invalid fix %d qp found set default qp 26\n",(char *)0x0);
      *(undefined4 *)((long)ctx + 0x5c) = 0x1a;
      iVar3 = 0x1a;
    }
    iVar10 = *(int *)((long)ctx + 0x60);
    if (*(int *)((long)ctx + 0x60) < 1) {
      *(int *)((long)ctx + 0x60) = iVar3;
      iVar10 = iVar3;
    }
    iVar4 = *(int *)((long)ctx + 100);
    if (*(int *)((long)ctx + 100) < 1) {
      *(int *)((long)ctx + 100) = iVar3;
      iVar4 = iVar3;
    }
    iVar9 = *(int *)((long)ctx + 0x68);
    if (*(int *)((long)ctx + 0x68) < 1) {
      *(int *)((long)ctx + 0x68) = iVar10;
      iVar9 = iVar10;
    }
    iVar12 = *(int *)((long)ctx + 0x6c);
    if (*(int *)((long)ctx + 0x6c) < 1) {
      *(int *)((long)ctx + 0x6c) = iVar4;
      iVar12 = iVar4;
    }
    uVar1 = (task->frm).val;
    if ((uVar1 & 0x10) == 0) {
      iVar12 = iVar4;
      iVar9 = iVar10;
    }
    (task->info).quality_max = iVar9;
    (task->info).quality_min = iVar12;
    (task->info).quality_target = iVar3;
    if (((rc_debug & 0x40) != 0) &&
       (_mpp_log_l(4,"rc_model_v2","seq_idx %d intra %d\n","rc_model_v2_start",uVar1 >> 0x30,
                   (ulong)((uint)(uVar1 >> 4) & 1)), (rc_debug & 0x40) != 0)) {
      uVar15 = CONCAT44(uVar16,(task->info).bit_max);
      _mpp_log_l(4,"rc_model_v2","bitrate [%d : %d : %d]\n","rc_model_v2_start",
                 (ulong)(uint)(task->info).bit_min,(ulong)(uint)(task->info).bit_target,uVar15);
      if ((rc_debug & 0x40) != 0) {
        _mpp_log_l(4,"rc_model_v2","quality [%d : %d : %d]\n","rc_model_v2_start",
                   (ulong)(uint)(task->info).quality_min,(ulong)(uint)(task->info).quality_target,
                   CONCAT44((int)((ulong)uVar15 >> 0x20),(task->info).quality_max));
      }
    }
  }
  else {
    if (*(int *)((long)ctx + 0x18) != 0) {
      RVar6 = mpp_time();
      *(RK_S64 *)((long)ctx + 0x298) = RVar6;
      iVar3 = *(int *)((long)ctx + 0x2a0) + 1;
      *(int *)((long)ctx + 0x2a0) = iVar3;
      if ((RVar6 != 0 && *(long *)((long)ctx + 0x290) != 0) &&
         (lVar13 = RVar6 - *(long *)((long)ctx + 0x290), 249999 < lVar13)) {
        uVar1 = (long)(iVar3 * 1000) / (long)((int)lVar13 / 1000);
        uVar14 = *(uint *)((long)ctx + 0x2a4);
        if ((0 < (int)uVar14) && (iVar3 = (int)uVar1, iVar3 != 0)) {
          iVar4 = uVar14 - iVar3;
          iVar10 = -iVar4;
          if (0 < iVar4) {
            iVar10 = iVar4;
          }
          if (*(int *)((long)ctx + 0xfc) < (int)((uint)(iVar10 * 100) / uVar14)) {
            uVar14 = *(int *)((long)ctx + 0x3c) * iVar3;
            uVar7 = 1;
            if (1 < (int)*(uint *)((long)ctx + 0x28)) {
              uVar7 = (ulong)*(uint *)((long)ctx + 0x28);
            }
            uVar8 = (ulong)*(uint *)((long)ctx + (ulong)(*(int *)((long)ctx + 8) != 1) * 4 + 0x34);
            *(ulong *)((long)ctx + 0x108) = (uVar7 * uVar8) / (uVar1 & 0xffffffff);
            value = (RK_S32)(uVar8 / (uVar1 & 0xffffffff));
            *(RK_S32 *)((long)ctx + 0x110) = value;
            if (*(MppDataV2 **)((long)ctx + 0x208) != (MppDataV2 *)0x0) {
              mpp_data_deinit_v2(*(MppDataV2 **)((long)ctx + 0x208));
              *(undefined8 *)((long)ctx + 0x208) = 0;
              value = *(RK_S32 *)((long)ctx + 0x110);
            }
            mpp_data_init_v2((MppDataV2 **)((long)ctx + 0x208),uVar14,value);
            if (*(MppDataV2 **)((long)ctx + 0x208) == (MppDataV2 *)0x0) {
              _mpp_log_l(2,"rc_model_v2","stat_bits init fail stat_len %d",(char *)0x0,(ulong)uVar14
                        );
            }
            _mpp_log_l(4,"rc_model_v2","fps chg from %d -> %d",(char *)0x0,
                       (ulong)*(uint *)((long)ctx + 0x2a4),uVar1 & 0xffffffff);
            *(int *)((long)ctx + 0x2a4) = iVar3;
            RVar6 = *(RK_S64 *)((long)ctx + 0x298);
          }
        }
        *(RK_S64 *)((long)ctx + 0x290) = RVar6;
        *(undefined4 *)((long)ctx + 0x2a0) = 0;
      }
    }
    uVar1 = (task->frm).val;
    EVar11 = INTER_VI_FRAME;
    if (((uint)uVar1 & 0x3f0000) != 0x30000) {
      EVar11 = (EncFrmType)(uVar1 >> 3) & INTRA_FRAME;
    }
    EVar5 = INTRA_RFH_FRAME;
    if ((uVar1 >> 0x26 & 1) == 0) {
      EVar5 = EVar11;
    }
    (task->info).frame_type = EVar5;
    *(undefined4 *)((long)ctx + 0x230) = 0;
    if (*(int *)((long)ctx + 0x104) == 2) {
      calc_next_i_ratio((RcModelV2Ctx *)ctx);
    }
    cfg = &task->info;
    if (*(int *)((long)ctx + 0x114) == 0) {
      if (*(code **)((long)ctx + 0x2a8) != (code *)0x0) {
        (**(code **)((long)ctx + 0x2a8))(ctx,cfg);
      }
    }
    else {
      bits_model_alloc((RcModelV2Ctx *)ctx,cfg,*(RK_S64 *)((long)ctx + 0x108));
      iVar3 = -1;
      if (0 < *(int *)((long)ctx + 0x5c)) {
        iVar3 = *(int *)((long)ctx + 0x5c);
      }
      (task->info).quality_target = iVar3;
    }
    uVar15 = *(undefined8 *)((long)ctx + (ulong)((*(uint *)&task->frm & 0x10) >> 1) + 0x60);
    (task->info).quality_max = (int)uVar15;
    (task->info).quality_min = (int)((ulong)uVar15 >> 0x20);
    bits_model_preset((RcModelV2Ctx *)ctx,cfg);
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","seq_idx %d intra %d\n","rc_model_v2_start",(task->frm).val >> 0x30
                 ,(ulong)((uint)((task->frm).val >> 4) & 1));
      if ((rc_debug & 0x40) != 0) {
        uVar15 = CONCAT44(uVar16,(task->info).bit_max);
        _mpp_log_l(4,"rc_model_v2","bitrate [%d : %d : %d]\n","rc_model_v2_start",
                   (ulong)(uint)(task->info).bit_min,(ulong)(uint)(task->info).bit_target,uVar15);
        if ((rc_debug & 0x40) != 0) {
          _mpp_log_l(4,"rc_model_v2","quality [%d : %d : %d]\n","rc_model_v2_start",
                     (ulong)(uint)(task->info).quality_min,(ulong)(uint)(task->info).quality_target,
                     CONCAT44((int)((ulong)uVar15 >> 0x20),(task->info).quality_max));
        }
      }
    }
    RVar2 = rc_debug;
    *(undefined4 *)((long)ctx + 0x268) = 0;
    *(EncFrmType *)((long)ctx + 0x104) = cfg->frame_type;
    if ((RVar2 & 1) != 0) {
      _mpp_log_l(4,"rc_model_v2","leave %p\n","rc_model_v2_start",ctx);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET rc_model_v2_start(void *ctx, EncRcTask *task)
{
    RcModelV2Ctx *p = (RcModelV2Ctx*)ctx;
    EncFrmStatus *frm = &task->frm;
    EncRcTaskInfo *info = &task->info;
    RcCfg *usr_cfg = &p->usr_cfg;

    rc_dbg_func("enter %p\n", ctx);

    if (usr_cfg->mode == RC_FIXQP) {
        if (usr_cfg->init_quality <= 0) {
            mpp_log("invalid fix %d qp found set default qp 26\n",
                    usr_cfg->init_quality);
            usr_cfg->init_quality = 26;
        }

        if (usr_cfg->max_quality <= 0)
            usr_cfg->max_quality = usr_cfg->init_quality;
        if (usr_cfg->min_quality <= 0)
            usr_cfg->min_quality = usr_cfg->init_quality;
        if (usr_cfg->max_i_quality <= 0)
            usr_cfg->max_i_quality = usr_cfg->max_quality;
        if (usr_cfg->min_i_quality <= 0)
            usr_cfg->min_i_quality = usr_cfg->min_quality;

        if (frm->is_intra) {
            info->quality_max = usr_cfg->max_i_quality;
            info->quality_min = usr_cfg->min_i_quality;
            info->quality_target = usr_cfg->init_quality;
        } else {
            info->quality_max = usr_cfg->max_quality;
            info->quality_min = usr_cfg->min_quality;
            info->quality_target = usr_cfg->init_quality;
        }

        rc_dbg_rc("seq_idx %d intra %d\n", frm->seq_idx, frm->is_intra);
        rc_dbg_rc("bitrate [%d : %d : %d]\n", info->bit_min, info->bit_target, info->bit_max);
        rc_dbg_rc("quality [%d : %d : %d]\n", info->quality_min, info->quality_target, info->quality_max);

        return MPP_OK;
    }

    if (usr_cfg->fps.fps_out_flex) {
        fps_chg_update_mode(ctx);
    }

    info->frame_type = (frm->is_intra) ? (INTRA_FRAME) : (INTER_P_FRAME);

    if (frm->ref_mode == REF_TO_PREV_INTRA)
        info->frame_type = INTER_VI_FRAME;

    if (frm->is_i_refresh)
        info->frame_type = INTRA_RFH_FRAME;

    p->next_ratio = 0;
    if (p->last_frame_type == INTRA_FRAME) {
        calc_next_i_ratio(p);
    }

    if (!p->first_frm_flg) {
        if (p->calc_ratio)
            p->calc_ratio(p, info);
    } else {
        bits_model_alloc(p, info, p->gop_total_bits);
        /* quality determination */
        info->quality_target = (usr_cfg->init_quality <= 0) ? -1 : usr_cfg->init_quality;
    }

    if (frm->is_intra) {
        info->quality_max = usr_cfg->max_i_quality;
        info->quality_min = usr_cfg->min_i_quality;
    } else {
        info->quality_max = usr_cfg->max_quality;
        info->quality_min = usr_cfg->min_quality;
    }

    bits_model_preset(p, info);

    rc_dbg_rc("seq_idx %d intra %d\n", frm->seq_idx, frm->is_intra);
    rc_dbg_rc("bitrate [%d : %d : %d]\n", info->bit_min, info->bit_target, info->bit_max);
    rc_dbg_rc("quality [%d : %d : %d]\n", info->quality_min, info->quality_target, info->quality_max);

    p->reenc_cnt = 0;
    p->last_frame_type = info->frame_type;

    rc_dbg_func("leave %p\n", ctx);

    return MPP_OK;
}